

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::MethodDescriptorProto::MethodDescriptorProto
          (MethodDescriptorProto *this,MethodDescriptorProto *from)

{
  void *pvVar1;
  string *psVar2;
  bool bVar3;
  uint uVar4;
  MethodOptions *this_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__MethodDescriptorProto_0070b700;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar4 = (from->_has_bits_).has_bits_[0];
  if (((uVar4 & 1) != 0) &&
     (psVar2 = (from->name_).ptr_,
     psVar2 != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,psVar2);
    uVar4 = (from->_has_bits_).has_bits_[0];
  }
  (this->input_type_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((uVar4 & 2) != 0) &&
     (psVar2 = (from->input_type_).ptr_,
     psVar2 != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&this->input_type_,psVar2);
    uVar4 = (from->_has_bits_).has_bits_[0];
  }
  (this->output_type_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((uVar4 & 4) != 0) &&
     (psVar2 = (from->output_type_).ptr_,
     psVar2 != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&this->output_type_,psVar2);
    uVar4 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar4 & 8) == 0) {
    this_00 = (MethodOptions *)0x0;
  }
  else {
    this_00 = (MethodOptions *)operator_new(0x70);
    MethodOptions::MethodOptions(this_00,from->options_);
  }
  this->options_ = this_00;
  bVar3 = from->server_streaming_;
  this->client_streaming_ = from->client_streaming_;
  this->server_streaming_ = bVar3;
  return;
}

Assistant:

MethodDescriptorProto::MethodDescriptorProto(const MethodDescriptorProto& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  input_type_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_input_type()) {
    input_type_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.input_type_);
  }
  output_type_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_output_type()) {
    output_type_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.output_type_);
  }
  if (from.has_options()) {
    options_ = new ::google::protobuf::MethodOptions(*from.options_);
  } else {
    options_ = NULL;
  }
  ::memcpy(&client_streaming_, &from.client_streaming_,
    reinterpret_cast<char*>(&server_streaming_) -
    reinterpret_cast<char*>(&client_streaming_) + sizeof(server_streaming_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.MethodDescriptorProto)
}